

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateReadBuffer
          (ShaderStorageBufferObjectBase *this,int x,int y,int w,int h,vec3 *expected)

{
  pointer pVVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  float *pfVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  allocator_type local_59;
  uint local_58;
  uint local_54;
  float local_50;
  float local_4c;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> display;
  
  pfVar6 = (float *)CONCAT44(in_register_0000000c,w);
  iVar5 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  bVar2 = *(byte *)(lVar11 + 8);
  bVar3 = *(byte *)(lVar11 + 0xc);
  bVar4 = *(byte *)(lVar11 + 0x10);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&display,(long)(y * x),&local_59);
  local_58 = x;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1907,0x1406,
             display.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (y < 1) {
    bVar9 = true;
  }
  else {
    local_4c = 1.0 / (float)(1 << (bVar2 & 0x1f));
    local_50 = 1.0 / (float)(1 << (bVar4 & 0x1f));
    uVar7 = (ulong)local_58;
    bVar9 = true;
    lVar11 = 0;
    uVar8 = 0;
    local_54 = y;
    do {
      if (0 < (int)local_58) {
        uVar10 = 0;
        do {
          pVVar1 = display.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + ((int)lVar11 + (int)uVar10);
          if (ABS(pVVar1->m_data[0] - *pfVar6) <= local_4c) {
            fVar12 = pfVar6[2];
            if ((1.0 / (float)(1 << (bVar3 & 0x1f)) < ABS(pVVar1->m_data[1] - pfVar6[1])) ||
               (local_50 < ABS(pVVar1->m_data[2] - fVar12))) goto LAB_00953c3d;
          }
          else {
            fVar12 = pfVar6[2];
LAB_00953c3d:
            anon_unknown_0::Output
                      ("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n",
                       (double)pVVar1->m_data[0],(double)pVVar1->m_data[1],(double)pVVar1->m_data[2]
                       ,(double)*pfVar6,(double)pfVar6[1],(double)fVar12,uVar10 & 0xffffffff,
                       (ulong)uVar8);
            bVar9 = false;
          }
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + uVar7;
    } while (uVar8 != local_54);
  }
  if (display.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec3& expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec3> display(w * h);
		glReadPixels(x, y, w, h, GL_RGB, GL_FLOAT, &display[0]);

		bool result = true;
		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n", x + i, y + j,
						   display[j * w + i][0], display[j * w + i][1], display[j * w + i][2], expected[0],
						   expected[1], expected[2]);
					result = false;
				}
			}
		}

		return result;
	}